

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmUVStream.h
# Opt level: O3

unique_ptr<cmUVStreamReadHandle,_std::default_delete<cmUVStreamReadHandle>_>
cmUVStreamRead<cmExecuteProcessCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::__3,cmExecuteProcessCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::__4>
          (uv_stream_t *stream,anon_class_32_4_7261a834 onRead,anon_class_8_1_29357872 onFinish)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  unique_ptr<cmUVStreamReadHandle,_std::default_delete<cmUVStreamReadHandle>_> uVar3;
  undefined8 in_RDX;
  pointer *__ptr;
  undefined4 extraout_var;
  
  puVar1 = (undefined8 *)operator_new(0x58);
  *puVar1 = 0;
  puVar1[1] = 0;
  puVar1[2] = 0;
  puVar1[3] = 0;
  puVar1[4] = 0;
  puVar1[5] = 0;
  puVar1[6] = 0;
  puVar1[7] = 0;
  puVar1[8] = 0;
  puVar1[9] = 0;
  puVar1[10] = 0;
  stream->data = puVar1;
  puVar2 = (undefined8 *)operator_new(0x20);
  puVar2[2] = onRead.errorData;
  puVar2[3] = onRead.strdata;
  *puVar2 = onRead.arguments;
  puVar2[1] = onRead.processOutput;
  puVar1[3] = puVar2;
  puVar1[4] = 0;
  puVar1[5] = std::
              _Function_handler<void_(std::vector<char,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmExecuteProcessCommand.cxx:334:7)>
              ::_M_manager;
  puVar1[6] = std::
              _Function_handler<void_(std::vector<char,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmExecuteProcessCommand.cxx:334:7)>
              ::_M_invoke;
  puVar1[7] = in_RDX;
  puVar1[8] = 0;
  puVar1[9] = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmExecuteProcessCommand.cxx:347:7)>
              ::_M_manager;
  puVar1[10] = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmExecuteProcessCommand.cxx:347:7)>
               ::_M_invoke;
  *(undefined8 **)onFinish.errorData = puVar1;
  uVar3._M_t.super___uniq_ptr_impl<cmUVStreamReadHandle,_std::default_delete<cmUVStreamReadHandle>_>
  ._M_t.super__Tuple_impl<0UL,_cmUVStreamReadHandle_*,_std::default_delete<cmUVStreamReadHandle>_>.
  super__Head_base<0UL,_cmUVStreamReadHandle_*,_false>._M_head_impl._0_4_ =
       uv_read_start((uv_stream_t *)onFinish.errorData,
                     cmUVStreamRead<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmExecuteProcessCommand.cxx:334:7),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmExecuteProcessCommand.cxx:347:7)>
                     ::anon_class_1_0_00000001::__invoke,
                     cmUVStreamRead<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmExecuteProcessCommand.cxx:334:7),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmExecuteProcessCommand.cxx:347:7)>
                     ::anon_class_1_0_00000001::__invoke);
  uVar3._M_t.super___uniq_ptr_impl<cmUVStreamReadHandle,_std::default_delete<cmUVStreamReadHandle>_>
  ._M_t.super__Tuple_impl<0UL,_cmUVStreamReadHandle_*,_std::default_delete<cmUVStreamReadHandle>_>.
  super__Head_base<0UL,_cmUVStreamReadHandle_*,_false>._M_head_impl._4_4_ = extraout_var;
  return (unique_ptr<cmUVStreamReadHandle,_std::default_delete<cmUVStreamReadHandle>_>)
         uVar3._M_t.
         super___uniq_ptr_impl<cmUVStreamReadHandle,_std::default_delete<cmUVStreamReadHandle>_>.
         _M_t.
         super__Tuple_impl<0UL,_cmUVStreamReadHandle_*,_std::default_delete<cmUVStreamReadHandle>_>.
         super__Head_base<0UL,_cmUVStreamReadHandle_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<cmUVStreamReadHandle> cmUVStreamRead(uv_stream_t* stream,
                                                     ReadCallback onRead,
                                                     FinishCallback onFinish)
{
  auto handle = cm::make_unique<cmUVStreamReadHandle>();
  handle->OnRead = std::move(onRead);
  handle->OnFinish = std::move(onFinish);

  stream->data = handle.get();
  uv_read_start(
    stream,
    [](uv_handle_t* s, std::size_t suggestedSize, uv_buf_t* buffer) {
      auto* data = static_cast<cmUVStreamReadHandle*>(s->data);
      data->Buffer.resize(suggestedSize);
      buffer->base = data->Buffer.data();
      buffer->len = suggestedSize;
    },
    [](uv_stream_t* s, ssize_t nread, const uv_buf_t* buffer) {
      auto* data = static_cast<cmUVStreamReadHandle*>(s->data);
      if (nread > 0) {
        (void)buffer;
        assert(buffer->base == data->Buffer.data());
        data->Buffer.resize(nread);
        data->OnRead(std::move(data->Buffer));
      } else if (nread < 0 /*|| nread == UV_EOF*/) {
        data->OnFinish();
        uv_read_stop(s);
      }
    });

  return handle;
}